

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O1

void __thiscall FileReader::FileReader(FileReader *this,long *filename)

{
  FILE *pFVar1;
  posixerror *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_ReadWriter)._readonly = false;
  (this->super_ReadWriter)._vptr_ReadWriter = (_func_int **)&PTR__FileReader_00145f78;
  (this->_filename)._M_dataplus._M_p = (pointer)&(this->_filename).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_filename,*filename,filename[1] + *filename);
  this->_state = STATE_FLUSHED;
  pFVar1 = fopen((this->_filename)._M_dataplus._M_p,"r+b");
  this->_f = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    return;
  }
  this_00 = (posixerror *)__cxa_allocate_exception(0x28);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"opening ","");
  std::operator+(&local_50,&local_70,&this->_filename);
  posixerror::posixerror(this_00,&local_50);
  __cxa_throw(this_00,&posixerror::typeinfo,posixerror::~posixerror);
}

Assistant:

FileReader(const std::string& filename, readwrite_t)
        : _filename(filename), _state(STATE_FLUSHED)
    {
        _f= fopen(_filename.c_str(), "r+b");
        if (_f==NULL)
            throw posixerror(std::string("opening ")+_filename);
        //printf("readwrite file: %p %s\n", _f, filename.c_str());
    }